

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

void okim6295_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  int local_2c;
  int i;
  okim6295_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *info_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  if (*(long *)((long)info + 0x100) != 0) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      generate_adpcm((okim6295_state *)info,
                     (okim_voice *)((long)info + (long)local_2c * 0x30 + 0x20),*outputs,samples);
    }
  }
  memcpy(outputs[1],*outputs,(ulong)samples << 2);
  return;
}

Assistant:

static void okim6295_update(void* info, UINT32 samples, DEV_SMPL** outputs)
{
	okim6295_state *chip = (okim6295_state *)info;
	int i;

	// reset the output stream
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));

	if (chip->ROM != NULL)
	{
		// iterate over voices and accumulate sample data
		for (i = 0; i < OKIM6295_VOICES; i++)
			generate_adpcm(chip, &chip->voice[i], outputs[0], samples);
	}

	memcpy(outputs[1], outputs[0], samples * sizeof(*outputs[0]));
}